

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Cond<tcu::Vector<float,_3>_>::doApply
          (IRet *__return_storage_ptr__,Cond<tcu::Vector<float,_3>_> *this,EvalContext *param_1,
          IArgs *iargs)

{
  bool *pbVar1;
  double dVar2;
  long lVar3;
  Interval *pIVar4;
  double *pdVar5;
  IRet *pIVar6;
  byte bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double local_60 [9];
  
  bVar7 = 0;
  lVar3 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar3 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar3;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x50);
  lVar3 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar3 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar3;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x50);
  pIVar4 = iargs->a;
  dVar2 = pIVar4->m_lo;
  uVar8 = SUB84(dVar2,0);
  uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
  if ((dVar2 <= 1.0) && (1.0 <= pIVar4->m_hi)) {
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doUnion
              (__return_storage_ptr__,iargs->b);
    pdVar5 = local_60;
    pIVar6 = __return_storage_ptr__;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(double *)pIVar6->m_data = *pdVar5;
      pdVar5 = pdVar5 + (ulong)bVar7 * -2 + 1;
      pIVar6 = (IRet *)((long)pIVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    pIVar4 = iargs->a;
    uVar8 = SUB84(pIVar4->m_lo,0);
    uVar9 = (undefined4)((ulong)pIVar4->m_lo >> 0x20);
  }
  if (((double)CONCAT44(uVar9,uVar8) <= 0.0) && (0.0 <= pIVar4->m_hi)) {
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doUnion
              (__return_storage_ptr__,iargs->c);
    pdVar5 = local_60;
    pIVar6 = __return_storage_ptr__;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(double *)pIVar6->m_data = *pdVar5;
      pdVar5 = pdVar5 + (ulong)bVar7 * -2 + 1;
      pIVar6 = (IRet *)((long)pIVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}